

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O1

cTValue * lj_tab_get(lua_State *L,GCtab *t,cTValue *key)

{
  double dVar1;
  int iVar2;
  cTValue *pcVar3;
  uint uVar4;
  cTValue *unaff_R15;
  char cVar5;
  
  uVar4 = (key->field_2).it;
  if (uVar4 == 0xfffffffb) {
    pcVar3 = (cTValue *)
             ((ulong)(t->node).ptr32 +
             (ulong)(t->hmask & *(uint *)((ulong)(key->u32).lo + 8)) * 0x18);
    do {
      if ((*(int *)((long)pcVar3 + 0xc) == -5) && (pcVar3[1].u32.lo == (key->u32).lo))
      goto LAB_00117189;
      pcVar3 = (cTValue *)(ulong)pcVar3[2].u32.lo;
    } while (pcVar3 != (cTValue *)0x0);
    pcVar3 = (cTValue *)0x0;
LAB_00117189:
    if (pcVar3 != (cTValue *)0x0) {
      return pcVar3;
    }
  }
  else {
    if (uVar4 < 0xfffeffff) {
      dVar1 = key->n;
      if ((dVar1 != (double)(int)dVar1) || (NAN(dVar1) || NAN((double)(int)dVar1))) {
        cVar5 = '\x02';
      }
      else {
        uVar4 = (uint)dVar1;
        if (uVar4 < t->asize) {
          unaff_R15 = (cTValue *)((ulong)(t->array).ptr32 + (long)(int)uVar4 * 8);
        }
        else {
          unaff_R15 = lj_tab_getinth(t,uVar4);
        }
        cVar5 = unaff_R15 != (cTValue *)0x0;
      }
      if (cVar5 == '\0') goto LAB_0011721d;
      if (cVar5 == '\x01') {
        return unaff_R15;
      }
    }
    else if (uVar4 == 0xffffffff) goto LAB_0011721d;
    pcVar3 = &hashkey(t,key)->val;
    do {
      iVar2 = lj_obj_equal(pcVar3 + 1,key);
      if (iVar2 != 0) {
        return pcVar3;
      }
      pcVar3 = (cTValue *)(ulong)pcVar3[2].u32.lo;
    } while (pcVar3 != (cTValue *)0x0);
  }
LAB_0011721d:
  return (cTValue *)((ulong)(L->glref).ptr32 + 0x130);
}

Assistant:

cTValue *lj_tab_get(lua_State *L, GCtab *t, cTValue *key)
{
  if (tvisstr(key)) {
    cTValue *tv = lj_tab_getstr(t, strV(key));
    if (tv)
      return tv;
  } else if (tvisint(key)) {
    cTValue *tv = lj_tab_getint(t, intV(key));
    if (tv)
      return tv;
  } else if (tvisnum(key)) {
    lua_Number nk = numV(key);
    int32_t k = lj_num2int(nk);
    if (nk == (lua_Number)k) {
      cTValue *tv = lj_tab_getint(t, k);
      if (tv)
	return tv;
    } else {
      goto genlookup;  /* Else use the generic lookup. */
    }
  } else if (!tvisnil(key)) {
    Node *n;
  genlookup:
    n = hashkey(t, key);
    do {
      if (lj_obj_equal(&n->key, key))
	return &n->val;
    } while ((n = nextnode(n)));
  }
  return niltv(L);
}